

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

void jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,error_code *ec)

{
  pointer pbVar1;
  jsonpointer_errc __e;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  pointer pbVar5;
  type tVar6;
  array_range_type aVar7;
  size_t index;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  pbVar5 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    do {
      if (pbVar5 == pbVar1) {
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(root);
        if (bVar3) {
          if ((buffer._M_string_length != 1) || (*buffer._M_dataplus._M_p != '-')) {
            index = 0;
            tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                              (buffer._M_dataplus._M_p,buffer._M_string_length,&index);
            sVar2 = index;
            if (tVar6.ec != success) {
              __e = invalid_index;
              goto LAB_002eda52;
            }
            sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root);
            if (sVar2 < sVar4) {
              aVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                                (root);
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                        (root,aVar7.first_._M_current._M_current + index);
              goto LAB_002eda5b;
            }
          }
          __e = index_exceeds_array_size;
        }
        else {
          bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(root);
          if (bVar3) {
            index = buffer._M_string_length;
            local_58 = buffer._M_dataplus._M_p;
            bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                              (root,(string_view_type *)&index);
            if (bVar3) {
              index = buffer._M_string_length;
              local_58 = buffer._M_dataplus._M_p;
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                        (root,(string_view_type *)&index);
              goto LAB_002eda5b;
            }
            __e = key_not_found;
          }
          else {
            __e = expected_object_or_array;
          }
        }
LAB_002eda52:
        std::error_code::operator=(ec,__e);
        goto LAB_002eda5b;
      }
      std::__cxx11::string::_M_assign((string *)&buffer);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 == pbVar1);
    index = buffer._M_string_length;
    local_58 = buffer._M_dataplus._M_p;
    root = detail::resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                     (root,(string_view_type *)&index,false,ec);
  } while (ec->_M_value == 0);
LAB_002eda5b:
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void remove(Json& root, const basic_json_pointer<typename Json::char_type>& location, std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, false, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->erase(current->array_range().begin()+index);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return;
            }
            else
            {
                current->erase(buffer);
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }